

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize
          (SmallVector<spirv_cross::Meta::Decoration,_0UL> *this,size_t new_size)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  Decoration *this_00;
  
  uVar1 = (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size;
  if (new_size < uVar1) {
    lVar3 = new_size * 0x168;
    for (sVar2 = new_size; sVar2 < uVar1; sVar2 = sVar2 + 1) {
      Meta::Decoration::~Decoration
                ((Decoration *)
                 ((long)&(((this->super_VectorView<spirv_cross::Meta::Decoration>).ptr)->alias).
                         _M_dataplus._M_p + lVar3));
      uVar1 = (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size;
      lVar3 = lVar3 + 0x168;
    }
  }
  else if (uVar1 < new_size) {
    reserve(this,new_size);
    sVar2 = (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size;
    lVar3 = sVar2 * 0x168;
    for (; sVar2 < new_size; sVar2 = sVar2 + 1) {
      this_00 = (Decoration *)
                ((long)&(((this->super_VectorView<spirv_cross::Meta::Decoration>).ptr)->alias).
                        _M_dataplus._M_p + lVar3);
      memset(this_00,0,0x168);
      Meta::Decoration::Decoration(this_00);
      lVar3 = lVar3 + 0x168;
    }
  }
  (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size = new_size;
  return;
}

Assistant:

void resize(size_t new_size) SPIRV_CROSS_NOEXCEPT
	{
		if (new_size < this->buffer_size)
		{
			for (size_t i = new_size; i < this->buffer_size; i++)
				this->ptr[i].~T();
		}
		else if (new_size > this->buffer_size)
		{
			reserve(new_size);
			for (size_t i = this->buffer_size; i < new_size; i++)
				new (&this->ptr[i]) T();
		}

		this->buffer_size = new_size;
	}